

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

uint32_t lzma_mf_bt3_find(lzma_mf *mf,lzma_match *matches)

{
  uint8_t *cur;
  uint8_t *puVar1;
  uint32_t *puVar2;
  lzma_match *plVar3;
  uint uVar4;
  uint32_t pos;
  uint len_limit;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint32_t uVar10;
  
  uVar8 = mf->read_pos;
  uVar4 = mf->write_pos - uVar8;
  len_limit = mf->nice_len;
  if (uVar4 < mf->nice_len) {
    if (uVar4 < 3) {
      if (mf->action == LZMA_RUN) {
        __assert_fail("mf->action != LZMA_RUN",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x2a8,"uint32_t lzma_mf_bt3_find(lzma_mf *, lzma_match *)");
      }
    }
    else {
      len_limit = uVar4;
      if (mf->action != LZMA_SYNC_FLUSH) goto LAB_004dd034;
    }
    move_pending(mf);
    uVar10 = 0;
  }
  else {
LAB_004dd034:
    puVar1 = mf->buffer;
    puVar2 = mf->hash;
    pos = mf->offset + uVar8;
    uVar5 = (uint)puVar1[(ulong)uVar8 + 1] ^ lzma_crc32_table[0][puVar1[uVar8]];
    uVar6 = uVar5 & 0x3ff;
    uVar4 = pos - puVar2[uVar6];
    cur = puVar1 + uVar8;
    uVar8 = (((uint)puVar1[(ulong)uVar8 + 2] << 8 ^ uVar5) & mf->hash_mask) + 0x400;
    uVar10 = puVar2[uVar8];
    puVar2[uVar6] = pos;
    puVar2[uVar8] = pos;
    uVar8 = mf->cyclic_size;
    uVar7 = 2;
    if ((uVar4 < uVar8) && (cur[-(ulong)uVar4] == *cur)) {
      if (len_limit != 2) {
        uVar7 = 2;
        do {
          if (cur[uVar7 - uVar4] != cur[uVar7]) {
            matches->len = (uint32_t)uVar7;
            matches->dist = uVar4 - 1;
            lVar9 = 1;
            goto LAB_004dd106;
          }
          uVar5 = (uint32_t)uVar7 + 1;
          uVar7 = (ulong)uVar5;
        } while (len_limit != uVar5);
      }
      matches->len = len_limit;
      matches->dist = uVar4 - 1;
      bt_skip_func(len_limit,pos,cur,uVar10,mf->depth,mf->son,mf->cyclic_pos,uVar8);
      move_pos(mf);
      uVar10 = 1;
    }
    else {
      lVar9 = 0;
LAB_004dd106:
      plVar3 = bt_find_func(len_limit,pos,cur,uVar10,mf->depth,mf->son,mf->cyclic_pos,uVar8,
                            matches + lVar9,(uint32_t)uVar7);
      uVar10 = (uint32_t)((ulong)((long)plVar3 - (long)matches) >> 3);
      move_pos(mf);
    }
  }
  return uVar10;
}

Assistant:

extern uint32_t
lzma_mf_bt3_find(lzma_mf *mf, lzma_match *matches)
{
	const uint8_t *cur;
	uint32_t pos;
	uint32_t temp, hash_value, hash_2_value; /* hash_3_calc */
	uint32_t delta2, cur_match;
	uint32_t len_best = 2;
	uint32_t matches_count = 0;

	header_find(true, 3);

	hash_3_calc();

	delta2 = pos - mf->hash[hash_2_value];
	cur_match = mf->hash[FIX_3_HASH_SIZE + hash_value];

	mf->hash[hash_2_value] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_value] = pos;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		for ( ; len_best != len_limit; ++len_best)
			if (*(cur + len_best - delta2) != cur[len_best])
				break;

		matches[0].len = len_best;
		matches[0].dist = delta2 - 1;
		matches_count = 1;

		if (len_best == len_limit) {
			bt_skip();
			return 1; // matches_count
		}
	}

	bt_find(len_best);
}